

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::ShaderProgramInputAttacher::drawContainer
          (ShaderProgramInputAttacher *this,GLuint program,Surface *dst)

{
  glAttachShaderFunc p_Var1;
  glDetachShaderFunc p_Var2;
  GLuint GVar3;
  deUint32 dVar4;
  deBool dVar5;
  RenderContext *pRVar6;
  Functions *pFVar7;
  TestError *pTVar8;
  TestLog *this_00;
  MessageBuilder *pMVar9;
  TestLog *this_01;
  TestLog *this_02;
  TestLog *this_03;
  TestLog *this_04;
  double __x;
  double __x_00;
  double dVar10;
  double __x_01;
  Rectangle RVar11;
  MessageBuilder local_868;
  MessageBuilder local_6e8;
  MessageBuilder local_568;
  GLuint local_3e4;
  undefined1 local_3e0 [4];
  GLint posLoc;
  MessageBuilder local_260;
  GLint local_e0;
  undefined1 auStack_dc [4];
  GLint linkStatus;
  Rectangle viewport;
  undefined1 local_98 [8];
  CheckedShader vtxShader;
  Random rnd;
  Surface *dst_local;
  ShaderProgramInputAttacher *pSStack_10;
  GLuint program_local;
  ShaderProgramInputAttacher *this_local;
  
  dst_local._4_4_ = program;
  pSStack_10 = this;
  de::Random::Random((Random *)&vtxShader.super_Shader.m_info.compileTimeUs,program);
  pRVar6 = ContextWrapper::getRenderContext(&(this->super_InputAttacher).super_ContextWrapper);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&viewport.height,
             "#version 100\nattribute vec2 pos; void main() { gl_Position = vec4(pos.xy, 0.0, 1.0); }\n"
             ,(allocator<char> *)((long)&viewport.width + 3));
  CheckedShader::CheckedShader
            ((CheckedShader *)local_98,pRVar6,SHADERTYPE_VERTEX,(string *)&viewport.height);
  std::__cxx11::string::~string((string *)&viewport.height);
  std::allocator<char>::~allocator((allocator<char> *)((long)&viewport.width + 3));
  pRVar6 = ContextWrapper::getRenderContext(&(this->super_InputAttacher).super_ContextWrapper);
  RVar11 = randomViewport(pRVar6,0x80,0x80,(Random *)&vtxShader.super_Shader.m_info.compileTimeUs);
  viewport._0_8_ = RVar11._8_8_;
  _auStack_dc = RVar11._0_8_;
  pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
  GVar3 = dst_local._4_4_;
  p_Var1 = pFVar7->attachShader;
  dVar4 = glu::Shader::getShader((Shader *)local_98);
  (*p_Var1)(GVar3,dVar4);
  pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
  (*pFVar7->linkProgram)(dst_local._4_4_);
  local_e0 = 0;
  pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
  (*pFVar7->getProgramiv)(dst_local._4_4_,0x8b82,&local_e0);
  while( true ) {
    dVar5 = ::deGetFalse();
    if ((dVar5 != 0) || (local_e0 == 0)) break;
    dVar5 = ::deGetFalse();
    if (dVar5 == 0) {
      ContextWrapper::log(&(this->super_InputAttacher).super_ContextWrapper,__x);
      tcu::TestLog::operator<<(&local_260,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_260,
                          (char (*) [58])"// Attached a temporary vertex shader and linked program "
                         );
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(uint *)((long)&dst_local + 4));
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_260);
      pRVar6 = ContextWrapper::getRenderContext(&(this->super_InputAttacher).super_ContextWrapper);
      setViewport(pRVar6,(Rectangle *)auStack_dc);
      ContextWrapper::log(&(this->super_InputAttacher).super_ContextWrapper,__x_00);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_3e0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_3e0,
                          (char (*) [32])"// Positioned viewport randomly");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3e0);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_InputAttacher).super_ContextWrapper.super_CallLogWrapper,
                 dst_local._4_4_);
      pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
      local_3e4 = (*pFVar7->getAttribLocation)(dst_local._4_4_,"pos");
      while( true ) {
        dVar5 = ::deGetFalse();
        if ((dVar5 != 0) || ((int)local_3e4 < 0)) break;
        dVar5 = ::deGetFalse();
        if (dVar5 == 0) {
          pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
          (*pFVar7->enableVertexAttribArray)(local_3e4);
          pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
          (*pFVar7->clearColor)(0.0,0.0,0.0,1.0);
          pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
          (*pFVar7->clear)(0x4100);
          pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
          (*pFVar7->vertexAttribPointer)(local_3e4,2,0x1406,'\0',0,drawContainer::s_vertices);
          pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
          (*pFVar7->drawArrays)(4,0,3);
          pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
          dVar10 = (double)(*pFVar7->disableVertexAttribArray)(local_3e4);
          ContextWrapper::log(&(this->super_InputAttacher).super_ContextWrapper,dVar10);
          tcu::TestLog::operator<<(&local_568,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_568,(char (*) [25])"// Drew a fixed triangle");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_568);
          glu::CallLogWrapper::glUseProgram
                    (&(this->super_InputAttacher).super_ContextWrapper.super_CallLogWrapper,0);
          pRVar6 = ContextWrapper::getRenderContext
                             (&(this->super_InputAttacher).super_ContextWrapper);
          readRectangle(pRVar6,(Rectangle *)auStack_dc,dst);
          ContextWrapper::log(&(this->super_InputAttacher).super_ContextWrapper,__x_01);
          tcu::TestLog::operator<<(&local_6e8,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_6e8,(char (*) [35])"// Copied viewport to output image");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_6e8);
          pFVar7 = ContextWrapper::gl(&(this->super_InputAttacher).super_ContextWrapper);
          GVar3 = dst_local._4_4_;
          p_Var2 = pFVar7->detachShader;
          dVar4 = glu::Shader::getShader((Shader *)local_98);
          dVar10 = (double)(*p_Var2)(GVar3,dVar4);
          ContextWrapper::log(&(this->super_InputAttacher).super_ContextWrapper,dVar10);
          tcu::TestLog::operator<<(&local_868,this_04,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (&local_868,(char (*) [35])"// Removed temporary vertex shader");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_868);
          CheckedShader::~CheckedShader((CheckedShader *)local_98);
          de::Random::~Random((Random *)&vtxShader.super_Shader.m_info.compileTimeUs);
          return;
        }
      }
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,(char *)0x0,"posLoc >= 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                 ,0x217);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,(char *)0x0,"linkStatus != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
             ,0x20a);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ShaderProgramInputAttacher::drawContainer (GLuint program, Surface& dst)
{
	static const float	s_vertices[6]	= { -1.0, 0.0, 1.0, 1.0, 0.0, -1.0 };
	Random				rnd				(program);
	CheckedShader		vtxShader		(getRenderContext(),
										 SHADERTYPE_VERTEX, s_vertexShaderSrc);
	const Rectangle		viewport		= randomViewport(getRenderContext(),
														 VIEWPORT_SIZE, VIEWPORT_SIZE, rnd);

	gl().attachShader(program, vtxShader.getShader());
	gl().linkProgram(program);

	{
		GLint linkStatus = 0;
		gl().getProgramiv(program, GL_LINK_STATUS, &linkStatus);
		TCU_CHECK(linkStatus != 0);
	}

	log() << TestLog::Message
		  << "// Attached a temporary vertex shader and linked program " << program
		  << TestLog::EndMessage;

	setViewport(getRenderContext(), viewport);
	log() << TestLog::Message << "// Positioned viewport randomly" << TestLog::EndMessage;

	glUseProgram(program);
	{
		GLint posLoc = gl().getAttribLocation(program, "pos");
		TCU_CHECK(posLoc >= 0);

		gl().enableVertexAttribArray(posLoc);

		gl().clearColor(0, 0, 0, 1);
		gl().clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
		gl().vertexAttribPointer(posLoc, 2, GL_FLOAT, GL_FALSE, 0, s_vertices);
		gl().drawArrays(GL_TRIANGLES, 0, 3);

		gl().disableVertexAttribArray(posLoc);
		log () << TestLog::Message << "// Drew a fixed triangle" << TestLog::EndMessage;
	}
	glUseProgram(0);

	readRectangle(getRenderContext(), viewport, dst);
	log() << TestLog::Message << "// Copied viewport to output image" << TestLog::EndMessage;

	gl().detachShader(program, vtxShader.getShader());
	log() << TestLog::Message << "// Removed temporary vertex shader" << TestLog::EndMessage;
}